

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O3

void __thiscall AudioScope::AudioScope(AudioScope *this,QWidget *parent)

{
  char cVar1;
  QPalette *pQVar2;
  WidgetAttribute WVar3;
  QPalette pal;
  QBrush local_40 [8];
  QPalette local_38 [16];
  QColor local_28;
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_001fe390;
  *(undefined ***)&this->field_0x10 = &PTR__AudioScope_001fe548;
  this->mBuffer = (Guarded<VisualizerBuffer> *)0x0;
  QColor::QColor(&this->mLineColor,white);
  WVar3 = (WidgetAttribute)this;
  QWidget::setAttribute(WVar3,true);
  QWidget::setAutoFillBackground(SUB81(this,0));
  pQVar2 = (QPalette *)QWidget::palette();
  QPalette::QPalette(local_38,pQVar2);
  QGuiApplication::palette();
  cVar1 = QPalette::isCopyOf(local_38);
  QPalette::~QPalette((QPalette *)&local_28);
  if (cVar1 != '\0') {
    QColor::QColor(&local_28,black);
    QBrush::QBrush(local_40,&local_28,SolidPattern);
    QPalette::setBrush((ColorGroup)local_38,Mid,(QBrush *)0xa);
    QBrush::~QBrush(local_40);
    QWidget::setPalette((QPalette *)this);
  }
  QFrame::setFrameStyle(WVar3);
  QFrame::setLineWidth(WVar3);
  QWidget::setFixedHeight(WVar3);
  QPalette::~QPalette(local_38);
  return;
}

Assistant:

AudioScope::AudioScope(QWidget *parent) :
    QFrame(parent),
    mBuffer(nullptr),
    mLineColor(Qt::white)
{
    setAttribute(Qt::WA_StyledBackground);
    setAutoFillBackground(true);

    // Window is the background, default is black
    // WindowText is the line color for the scope, default is white
    auto pal = palette();
    if (pal.isCopyOf(QGuiApplication::palette())) {
        // only modify the palette if we have the default one
        pal.setColor(QPalette::Window, Qt::black);
        setPalette(pal);
    }

    setFrameStyle(QFrame::Box | QFrame::Plain);
    
    setLineWidth(TU::LINE_WIDTH);
    setFixedHeight(WAVE_HEIGHT * 2 + TU::LINE_WIDTH * 2);

}